

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O1

void uhttp_client_dowork(HTTP_CLIENT_HANDLE handle)

{
  _Bool _Var1;
  STRING_HANDLE s2;
  XIO_HANDLE xio;
  int iVar2;
  LIST_ITEM_HANDLE item_handle;
  int *__ptr;
  size_t size;
  char *pcVar3;
  size_t sVar4;
  STRING_HANDLE s1;
  LOGGER_LOG p_Var5;
  char *pcVar6;
  char *pcVar7;
  uchar *buffer;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  char *pcVar16;
  ulong uVar17;
  char *local_58;
  
  if ((handle != (HTTP_CLIENT_HANDLE)0x0) &&
     (xio_dowork(handle->xio_handle), handle->connected == 1)) {
    item_handle = singlylinkedlist_get_head_item(handle->data_list);
    while (item_handle != (LIST_ITEM_HANDLE)0x0) {
      __ptr = (int *)singlylinkedlist_item_get_value(item_handle);
      if (__ptr != (int *)0x0) {
        size = BUFFER_length(*(BUFFER_HANDLE *)(__ptr + 6));
        iVar2 = *__ptr;
        pcVar3 = STRING_c_str(*(STRING_HANDLE *)(__ptr + 2));
        uVar11 = iVar2 - 1;
        if (uVar11 < 5) {
          pcVar16 = &DAT_00115df4 + *(int *)(&DAT_00115df4 + (ulong)uVar11 * 4);
        }
        else {
          pcVar16 = (char *)0x0;
          if (iVar2 == 6) {
            pcVar16 = "PATCH";
          }
        }
        if (pcVar16 == (char *)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"construct_http_data",0x3eb,1,"Invalid request method %s specified",0);
          }
          s1 = (STRING_HANDLE)0x0;
        }
        else {
          s2 = *(STRING_HANDLE *)(__ptr + 4);
          sVar4 = strlen(pcVar16);
          uVar17 = sVar4 + 0x10;
          if (0xffffffffffffffef < sVar4) {
            uVar17 = 0xffffffffffffffff;
          }
          sVar4 = strlen(pcVar3);
          lVar12 = sVar4 + uVar17;
          if (CARRY8(sVar4,uVar17)) {
            lVar12 = -1;
          }
          sVar4 = lVar12 + 1;
          if (sVar4 == 0) {
            sVar4 = 0xffffffffffffffff;
          }
          if ((sVar4 == 0xffffffffffffffff) ||
             (pcVar3 = (char *)malloc(sVar4), pcVar3 == (char *)0x0)) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"construct_http_data",0x3f9,1,"Failure allocating Request data, size:%zu",
                        sVar4);
            }
            s1 = (STRING_HANDLE)0x0;
          }
          else {
            iVar2 = snprintf(pcVar3,sVar4,"%s %s HTTP/1.1\r\n",pcVar16);
            if (iVar2 < 1) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                iVar2 = 0x400;
                pcVar16 = "Failure writing request buffer";
LAB_00105cae:
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"construct_http_data",iVar2,1,pcVar16);
              }
LAB_00105cb3:
              s1 = (STRING_HANDLE)0x0;
            }
            else {
              s1 = STRING_construct(pcVar3);
              if (s1 == (STRING_HANDLE)0x0) {
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  iVar2 = 0x407;
                  pcVar16 = "Failure creating buffer object";
                  goto LAB_00105cae;
                }
                goto LAB_00105cb3;
              }
              iVar2 = STRING_concat_with_STRING(s1,s2);
              if (iVar2 != 0) {
                STRING_delete(s1);
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  iVar2 = 0x40d;
                  pcVar16 = "Failure writing request buffers";
                  goto LAB_00105cae;
                }
                goto LAB_00105cb3;
              }
            }
            free(pcVar3);
          }
        }
        if (s1 == (STRING_HANDLE)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"send_http_data",0x41d,1,"Failure constructing http data");
          }
LAB_00106071:
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            iVar2 = 0x5a6;
LAB_00106093:
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"uhttp_client_dowork",iVar2,1,"Failure writing content buffer");
          }
LAB_001060a5:
          if (handle->on_error != (ON_HTTP_ERROR_CALLBACK)0x0) {
            (*handle->on_error)(handle->error_user_ctx,HTTP_CALLBACK_REASON_SEND_FAILED);
          }
        }
        else {
          pcVar3 = STRING_c_str(s1);
          xio = handle->xio_handle;
          sVar4 = strlen(pcVar3);
          iVar2 = xio_send(xio,pcVar3,sVar4,send_complete_callback,(void *)0x0);
          if (iVar2 == 0) {
            if (handle->trace_on == true) {
              pcVar16 = strstr(pcVar3,"\r\nAuthorization:");
              pcVar6 = strstr(pcVar3,"\r\nProxy-Authorization:");
              if (pcVar16 == (char *)0x0) {
                local_58 = (char *)0x0;
              }
              else {
                local_58 = strstr(pcVar16 + 1,"\r\n");
              }
              if (pcVar6 == (char *)0x0) {
                pcVar7 = (char *)0x0;
              }
              else {
                pcVar7 = strstr(pcVar6 + 1,"\r\n");
              }
              if (pcVar16 == (char *)0x0 && pcVar6 == (char *)0x0) {
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"log_text_line",0x153,1,"%s",pcVar3);
                }
              }
              else {
                iVar15 = (int)pcVar3;
                iVar10 = (int)pcVar16;
                if (pcVar6 == (char *)0x0) {
                  if ((local_58 != (char *)0x0) &&
                     (p_Var5 = xlogging_get_log_function(), p_Var5 != (LOGGER_LOG)0x0)) {
                    sVar4 = strlen(pcVar3);
                    (*p_Var5)(AZ_LOG_TRACE,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                              ,"log_text_line",0x15b,1,"%.*s \r\nAuthorization: *** %.*s",
                              (ulong)(uint)(iVar10 - iVar15),pcVar3,
                              (ulong)(uint)((int)sVar4 + (iVar15 - (int)local_58)),local_58);
                  }
                }
                else {
                  iVar8 = (int)pcVar6;
                  iVar13 = (int)pcVar7;
                  if (pcVar16 == (char *)0x0) {
                    if ((pcVar7 != (char *)0x0) &&
                       (p_Var5 = xlogging_get_log_function(), p_Var5 != (LOGGER_LOG)0x0)) {
                      sVar4 = strlen(pcVar3);
                      (*p_Var5)(AZ_LOG_TRACE,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                                ,"log_text_line",0x164,1,"%.*s \r\nProxy-Authorization: *** %.*s",
                                (ulong)(uint)(iVar8 - iVar15),pcVar3,
                                (ulong)(uint)((int)sVar4 + (iVar15 - iVar13)),pcVar7);
                    }
                  }
                  else {
                    p_Var5 = xlogging_get_log_function();
                    if (pcVar16 < pcVar6) {
                      if (p_Var5 != (LOGGER_LOG)0x0) {
                        uVar11 = iVar10 - iVar15;
                        uVar9 = iVar8 - (int)local_58;
                        uVar14 = iVar13 - iVar15;
                        iVar10 = 0x16e;
                        pcVar6 = 
                        "%.*s \r\nAuthorization: *** %.*s \r\nProxy-Authorization: *** %.*s";
                        pcVar16 = local_58;
                        local_58 = pcVar7;
LAB_0010601a:
                        (*p_Var5)(AZ_LOG_TRACE,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                                  ,"log_text_line",iVar10,1,pcVar6,(ulong)uVar11,pcVar3,(ulong)uVar9
                                  ,pcVar16,(ulong)uVar14,local_58);
                      }
                    }
                    else if (p_Var5 != (LOGGER_LOG)0x0) {
                      uVar11 = iVar8 - iVar15;
                      uVar9 = iVar10 - iVar13;
                      uVar14 = (int)local_58 - iVar15;
                      iVar10 = 0x175;
                      pcVar6 = "%.*s \r\nProxy-Authorization: *** %.*s \r\nAuthorization: *** %.*s";
                      pcVar16 = pcVar7;
                      goto LAB_0010601a;
                    }
                  }
                }
              }
            }
          }
          else {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"write_text_line",0x180,1,"Failure calling xio_send.");
            }
          }
          if (iVar2 == 0) {
            STRING_delete(s1);
          }
          else {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"send_http_data",0x426,1,"Failure writing request buffer");
            }
            STRING_delete(s1);
            if (iVar2 != 0) goto LAB_00106071;
          }
          if (size != 0) {
            buffer = BUFFER_u_char(*(BUFFER_HANDLE *)(__ptr + 6));
            iVar2 = xio_send(handle->xio_handle,buffer,size,send_complete_callback,(void *)0x0);
            if (iVar2 == 0) {
              if (handle->trace_on == true) {
                _Var1 = handle->trace_body;
                p_Var5 = xlogging_get_log_function();
                if (_Var1 == true) {
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_TRACE,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                              ,"write_data_line",0x19f,1,"len: %d\r\n%.*s\r\n",size,size,buffer);
                  }
                }
                else if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"write_data_line",0x1a3,1,"<data> len: %d\r\n",size);
                }
              }
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"write_data_line",0x193,1,"Failure calling xio_send.");
              }
            }
            if (iVar2 != 0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                iVar2 = 0x5b1;
                goto LAB_00106093;
              }
              goto LAB_001060a5;
            }
          }
        }
        STRING_delete(*(STRING_HANDLE *)(__ptr + 2));
        BUFFER_delete(*(BUFFER_HANDLE *)(__ptr + 6));
        STRING_delete(*(STRING_HANDLE *)(__ptr + 4));
        free(__ptr);
      }
      singlylinkedlist_remove(handle->data_list,item_handle);
      item_handle = singlylinkedlist_get_head_item(handle->data_list);
    }
  }
  return;
}

Assistant:

void uhttp_client_dowork(HTTP_CLIENT_HANDLE handle)
{
    if (handle != NULL)
    {
        /* Codes_SRS_UHTTP_07_037: [http_client_dowork shall call the underlying xio_dowork function. ] */
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;
        xio_dowork(http_data->xio_handle);

        // Wait till I'm connected
        if (handle->connected == 1)
        {
            LIST_ITEM_HANDLE pending_list_item;
            /* Codes_SRS_UHTTP_07_016: [http_client_dowork shall iterate through the queued Data using the xio interface to send the http request in the following ways...] */
            while ((pending_list_item = singlylinkedlist_get_head_item(http_data->data_list)) != NULL)
            {
                HTTP_SEND_DATA* send_data = (HTTP_SEND_DATA*)singlylinkedlist_item_get_value(pending_list_item);
                if (send_data != NULL)
                {
                    size_t content_len = BUFFER_length(send_data->content);
                    /* Codes_SRS_UHTTP_07_052: [uhttp_client_dowork shall call xio_send to transmits the header information... ] */
                    if (send_http_data(http_data, send_data->request_type, STRING_c_str(send_data->relative_path), send_data->header_line) != 0)
                    {
                        LogError("Failure writing content buffer");
                        if (http_data->on_error)
                        {
                            http_data->on_error(http_data->error_user_ctx, HTTP_CALLBACK_REASON_SEND_FAILED);
                        }
                    }
                    else if (content_len > 0)
                    {
                        /* Codes_SRS_UHTTP_07_053: [ Then uhttp_client_dowork shall use xio_send to transmit the content of the http request. ] */
                        if (write_data_line(http_data, BUFFER_u_char(send_data->content), content_len) != 0)
                        {
                            LogError("Failure writing content buffer");
                            if (http_data->on_error)
                            {
                                http_data->on_error(http_data->error_user_ctx, HTTP_CALLBACK_REASON_SEND_FAILED);
                            }
                        }
                    }

                    /* Codes_SRS_UHTTP_07_046: [ http_client_dowork shall free resouces queued to send to the http endpoint. ] */
                    STRING_delete(send_data->relative_path);
                    BUFFER_delete(send_data->content);
                    STRING_delete(send_data->header_line);
                    free(send_data);
                }
                (void)singlylinkedlist_remove(http_data->data_list, pending_list_item);
            }
        }
    }
}